

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointTriface.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLinkPointTrifaceRot::ChLinkPointTrifaceRot
          (ChLinkPointTrifaceRot *this,ChLinkPointTrifaceRot *other)

{
  double dVar1;
  undefined1 auVar2 [32];
  
  ChLinkBase::ChLinkBase(&this->super_ChLinkBase,&other->super_ChLinkBase);
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkPointTrifaceRot_01174bf8;
  (this->react).m_data[2] = 0.0;
  (this->react).m_data[0] = 0.0;
  (this->react).m_data[1] = 0.0;
  ChConstraintTwoTuples<chrono::fea::ChNodeFEAxyz,_chrono::fea::ChTriangleOfXYZROTnodes>::
  ChConstraintTwoTuples(&this->constraint1);
  ChConstraintTwoTuples<chrono::fea::ChNodeFEAxyz,_chrono::fea::ChTriangleOfXYZROTnodes>::
  ChConstraintTwoTuples(&this->constraint2);
  ChConstraintTwoTuples<chrono::fea::ChNodeFEAxyz,_chrono::fea::ChTriangleOfXYZROTnodes>::
  ChConstraintTwoTuples(&this->constraint3);
  (this->mnodeA).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mnodeA).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mtriangle).super_ChVariableTupleCarrier_3vars<6,_6,_6>._vptr_ChVariableTupleCarrier_3vars =
       (_func_int **)&PTR__ChTriangleOfXYZROTnodes_01174ed0;
  auVar2 = ZEXT432(0) << 0x40;
  (this->mtriangle).mnodeB1 = (shared_ptr<chrono::fea::ChNodeFEAxyzrot>)auVar2._0_16_;
  (this->mtriangle).mnodeB2 = (shared_ptr<chrono::fea::ChNodeFEAxyzrot>)auVar2._16_16_;
  (this->mtriangle).mnodeB2 = (shared_ptr<chrono::fea::ChNodeFEAxyzrot>)auVar2._0_16_;
  (this->mtriangle).mnodeB3 = (shared_ptr<chrono::fea::ChNodeFEAxyzrot>)auVar2._16_16_;
  if (other != this) {
    (this->react).m_data[0] = (other->react).m_data[0];
    (this->react).m_data[1] = (other->react).m_data[1];
    (this->react).m_data[2] = (other->react).m_data[2];
  }
  dVar1 = other->s3;
  this->s2 = other->s2;
  this->s3 = dVar1;
  this->d = other->d;
  return;
}

Assistant:

ChLinkPointTrifaceRot::ChLinkPointTrifaceRot(const ChLinkPointTrifaceRot& other) : ChLinkBase(other) {
    react = other.react;
    s2 = other.s2;
    s3 = other.s3;
    d = other.d;
}